

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::Sphere::Sphere(Sphere *this,SP *material)

{
  SP *in_RDI;
  shared_ptr<pbrt::Material> *in_stack_ffffffffffffffb8;
  affine3f *this_00;
  Shape *in_stack_ffffffffffffffd0;
  
  this_00 = (affine3f *)&stack0xffffffffffffffe0;
  std::shared_ptr<pbrt::Material>::shared_ptr
            ((shared_ptr<pbrt::Material> *)this_00,in_stack_ffffffffffffffb8);
  Shape::Shape(in_stack_ffffffffffffffd0,in_RDI);
  std::shared_ptr<pbrt::Material>::~shared_ptr((shared_ptr<pbrt::Material> *)0x14cbb0);
  (in_RDI->super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR_toString_abi_cxx11__002208f0;
  math::affine3f::affine3f(this_00);
  *(undefined4 *)&in_RDI[10].super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       0x3f800000;
  return;
}

Assistant:

Sphere(Material::SP material=Material::SP()) : Shape(material) {}